

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

unsigned_long tjPlaneSizeYUV(int componentID,int width,int stride,int height,int subsamp)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  long *in_FS_OFFSET;
  int ph;
  int pw;
  unsigned_long_long retval;
  int in_stack_ffffffffffffffe0;
  int local_14;
  unsigned_long local_8;
  
  if ((((in_ESI < 1) || (in_ECX < 1)) || (in_R8D < 0)) || (5 < in_R8D)) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"%s","tjPlaneSizeYUV(): Invalid argument");
    local_8 = 0xffffffffffffffff;
  }
  else {
    iVar1 = tjPlaneWidth(in_R8D,in_stack_ffffffffffffffe0,0);
    iVar2 = tjPlaneHeight(in_R8D,in_stack_ffffffffffffffe0,0);
    if ((iVar1 < 0) || (iVar2 < 0)) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      local_14 = iVar1;
      if ((in_EDX != 0) && (local_14 = in_EDX, in_EDX < 1)) {
        local_14 = -in_EDX;
      }
      local_8 = (long)local_14 * (long)(iVar2 + -1) + (long)iVar1;
    }
  }
  return local_8;
}

Assistant:

DLLEXPORT unsigned long tjPlaneSizeYUV(int componentID, int width, int stride,
                                       int height, int subsamp)
{
  unsigned long long retval = 0;
  int pw, ph;

  if (width < 1 || height < 1 || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROWG("tjPlaneSizeYUV(): Invalid argument");

  pw = tjPlaneWidth(componentID, width, subsamp);
  ph = tjPlaneHeight(componentID, height, subsamp);
  if (pw < 0 || ph < 0) return -1;

  if (stride == 0) stride = pw;
  else stride = abs(stride);

  retval = (unsigned long long)stride * (ph - 1) + pw;
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("tjPlaneSizeYUV(): Image is too large");

bailout:
  return (unsigned long)retval;
}